

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswClass.c
# Opt level: O2

Ssw_Cla_t * Ssw_ClassesPreparePairsSimple(Aig_Man_t *pMiter,Vec_Int_t *vPairs)

{
  int iVar1;
  Ssw_Cla_t *p;
  Aig_Obj_t **ppAVar2;
  Aig_Obj_t *pRepr;
  Aig_Obj_t *pObj;
  long lVar3;
  long lVar4;
  ulong uVar5;
  
  p = Ssw_ClassesStart(pMiter);
  uVar5 = (ulong)vPairs->nSize;
  ppAVar2 = (Aig_Obj_t **)malloc(uVar5 << 3);
  p->pMemClasses = ppAVar2;
  lVar3 = 0;
  lVar4 = 0;
  while( true ) {
    if ((int)uVar5 <= lVar4) {
      p->pMemClassesFree = (Aig_Obj_t **)0x0;
      Ssw_ClassesCheck(p);
      return p;
    }
    iVar1 = Vec_IntEntry(vPairs,(int)lVar4);
    pRepr = Aig_ManObj(pMiter,iVar1);
    iVar1 = Vec_IntEntry(vPairs,(int)lVar4 + 1);
    pObj = Aig_ManObj(pMiter,iVar1);
    if (pObj->Id <= pRepr->Id) break;
    Aig_ObjSetRepr(pMiter,pObj,pRepr);
    ppAVar2 = p->pMemClasses;
    ppAVar2[lVar4] = pRepr;
    ppAVar2[lVar4 + 1] = pObj;
    Ssw_ObjAddClass(p,pRepr,(Aig_Obj_t **)((long)ppAVar2 + lVar3),2);
    lVar4 = lVar4 + 2;
    uVar5 = (ulong)(uint)vPairs->nSize;
    lVar3 = lVar3 + 0x10;
  }
  __assert_fail("Aig_ObjId(pRepr) < Aig_ObjId(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswClass.c"
                ,0x3af,"Ssw_Cla_t *Ssw_ClassesPreparePairsSimple(Aig_Man_t *, Vec_Int_t *)");
}

Assistant:

Ssw_Cla_t * Ssw_ClassesPreparePairsSimple( Aig_Man_t * pMiter, Vec_Int_t * vPairs )
{
    Ssw_Cla_t * p;
    Aig_Obj_t ** ppClassNew;
    Aig_Obj_t * pObj, * pRepr;
    int i;
    // start the classes
    p = Ssw_ClassesStart( pMiter );
    // allocate memory for classes
    p->pMemClasses = ABC_ALLOC( Aig_Obj_t *, Vec_IntSize(vPairs) );
    // create classes
    for ( i = 0; i < Vec_IntSize(vPairs); i += 2 )
    {
        pRepr = Aig_ManObj( pMiter, Vec_IntEntry(vPairs, i) );
        pObj  = Aig_ManObj( pMiter, Vec_IntEntry(vPairs, i+1) );
        assert( Aig_ObjId(pRepr) < Aig_ObjId(pObj) );
        Aig_ObjSetRepr( pMiter, pObj, pRepr );
        // get room for storing the class
        ppClassNew = p->pMemClasses + i;
        ppClassNew[0] = pRepr;
        ppClassNew[1] = pObj;
        // create new class
        Ssw_ObjAddClass( p, pRepr, ppClassNew, 2 );
    }
    // prepare room for new classes
    p->pMemClassesFree = NULL;
    Ssw_ClassesCheck( p );
//    Ssw_ClassesPrint( p, 0 );
    return p;
}